

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_estimator.c
# Opt level: O0

void WebRtcIsac_InitializePitch
               (double *in,double old_lag,double old_gain,PitchAnalysisStruct *State,double *lags)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dStack_4378;
  int row;
  double T [3] [3];
  double local_4328;
  double lags2 [10];
  double lags1 [10];
  double peak_vals [10];
  double intrp_d;
  double intrp_c;
  double intrp_b;
  double intrp_a;
  double corr_max;
  double corr;
  double gain_tmp;
  double adj;
  int peaks [10];
  int local_41c8;
  int max_ind;
  int peak;
  int peaks_ind;
  int ind2;
  int ind1;
  double LagWin [3];
  double *CorrSurfPtr2;
  double *CorrSurfPtr1;
  double *CorrSurf [25];
  double local_40b8;
  double corrSurfBuff [1735];
  int k;
  int m;
  double corrvec2 [65];
  double local_868;
  double corrvec1 [65];
  double bias;
  double gain_bias;
  double log_lag;
  double ratio;
  double buf_dec [192];
  double *lags_local;
  PitchAnalysisStruct *State_local;
  double old_gain_local;
  double old_lag_local;
  double *in_local;
  
  _ind2 = 0x3fc999999999999a;
  LagWin[0] = 0.5;
  LagWin[1] = 0.98;
  for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < 0x19;
      corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
    CorrSurf[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
         corrSurfBuff + (long)(corrSurfBuff[0x6c6]._0_4_ * 0x45 + 10) + -1;
  }
  memset(&local_40b8,0,0x3638);
  peaks[9] = 0;
  local_41c8 = 0;
  memcpy(&ratio,State,0x240);
  WebRtcIsac_DecimateAllpass(in,State->decimator_state,0xf0,buf_dec + 0x47);
  for (corrSurfBuff[0x6c6]._0_4_ = 0x48; corrSurfBuff[0x6c6]._0_4_ < 0xc0;
      corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
    buf_dec[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
         buf_dec[(long)(corrSurfBuff[0x6c6]._0_4_ + -1) + -1] * 0.75 +
         -(buf_dec[(long)(corrSurfBuff[0x6c6]._0_4_ + -2) + -1] * 0.25) +
         buf_dec[(long)corrSurfBuff[0x6c6]._0_4_ + -1];
  }
  memcpy(State,buf_dec + 0x77,0x240);
  PCorr(&ratio,&local_868);
  PCorr(buf_dec + 0x3b,(double *)&k);
  dVar4 = log(old_lag * 0.5);
  bias = old_gain * 4.0 * old_gain;
  if (0.8 < bias) {
    bias = 0.8;
  }
  for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < 0x41;
      corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
    dVar5 = log((double)(corrSurfBuff[0x6c6]._0_4_ + 8));
    dVar5 = exp((dVar5 - dVar4) * -5.0 * (dVar5 - dVar4));
    corrvec1[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
         (bias * dVar5 + 1.0) * corrvec1[(long)corrSurfBuff[0x6c6]._0_4_ + -1];
  }
  for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < 3;
      corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
    corr = *(double *)(&ind2 + (long)corrSurfBuff[0x6c6]._0_4_ * 2);
    corrvec1[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
         corr * corrvec1[(long)corrSurfBuff[0x6c6]._0_4_ + -1];
    *(double *)(&k + (long)corrSurfBuff[0x6c6]._0_4_ * 2) =
         corr * *(double *)(&k + (long)corrSurfBuff[0x6c6]._0_4_ * 2);
    corrvec1[(long)(0x40 - corrSurfBuff[0x6c6]._0_4_) + -1] =
         corr * corrvec1[(long)(0x40 - corrSurfBuff[0x6c6]._0_4_) + -1];
    *(double *)(&k + (long)(0x40 - corrSurfBuff[0x6c6]._0_4_) * 2) =
         corr * *(double *)(&k + (long)(0x40 - corrSurfBuff[0x6c6]._0_4_) * 2);
  }
  intrp_a = 0.0;
  peaks_ind = 0;
  peak = 0;
  for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < 0x41;
      corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
    corr_max = corrvec1[(long)peaks_ind + -1] + *(double *)(&k + (long)peak * 2);
    CorrSurf[10][(long)corrSurfBuff[0x6c6]._0_4_ + 2] = corr_max;
    if (intrp_a < corr_max) {
      intrp_a = corr_max;
      peaks[9] = (int)((long)CorrSurf[10] +
                       (((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x10) - (long)CorrSurfPtr1) >> 3);
    }
    peak = peak + 1;
    peaks_ind = peaks_ind + 1;
  }
  peaks_ind = 0;
  peak = 0xb;
  for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < 0x36;
      corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
    dVar4 = (double)(peaks_ind + 0xc) / (double)(peak + 0xc);
    gain_tmp = dVar4 * 0.2 * (2.0 - dVar4);
    corr_max = gain_tmp * (corrvec1[(long)peaks_ind + -1] + *(double *)(&k + (long)peak * 2));
    CorrSurfPtr1[(long)corrSurfBuff[0x6c6]._0_4_ + 2] = corr_max;
    if (intrp_a < corr_max) {
      intrp_a = corr_max;
      peaks[9] = (int)((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x10 >> 3);
    }
    corr_max = gain_tmp * (corrvec1[(long)peak + -1] + *(double *)(&k + (long)peaks_ind * 2));
    CorrSurf[0x15][(long)corrSurfBuff[0x6c6]._0_4_ + 0xd] = corr_max;
    if (intrp_a < corr_max) {
      intrp_a = corr_max;
      peaks[9] = (int)((long)CorrSurf[0x15] +
                       (((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x68) - (long)CorrSurfPtr1) >> 3);
    }
    peak = peak + 1;
    peaks_ind = peaks_ind + 1;
  }
  peaks_ind = 0;
  peak = 10;
  for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < 0x37;
      corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
    dVar4 = (double)(peaks_ind + 0xc) / (double)(peak + 0xc);
    gain_tmp = dVar4 * 0.9 * (2.0 - dVar4);
    corr_max = gain_tmp * (corrvec1[(long)peaks_ind + -1] + *(double *)(&k + (long)peak * 2));
    CorrSurf[0][(long)corrSurfBuff[0x6c6]._0_4_ + 2] = corr_max;
    if (intrp_a < corr_max) {
      intrp_a = corr_max;
      peaks[9] = (int)((long)CorrSurf[0] +
                       (((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x10) - (long)CorrSurfPtr1) >> 3);
    }
    corr_max = gain_tmp * (corrvec1[(long)peak + -1] + *(double *)(&k + (long)peaks_ind * 2));
    CorrSurf[0x14][(long)corrSurfBuff[0x6c6]._0_4_ + 0xc] = corr_max;
    if (intrp_a < corr_max) {
      intrp_a = corr_max;
      peaks[9] = (int)((long)CorrSurf[0x14] +
                       (((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x60) - (long)CorrSurfPtr1) >> 3);
    }
    peak = peak + 1;
    peaks_ind = peaks_ind + 1;
  }
  for (corrSurfBuff[0x6c6]._4_4_ = 2; corrSurfBuff[0x6c6]._4_4_ < 0xb;
      corrSurfBuff[0x6c6]._4_4_ = corrSurfBuff[0x6c6]._4_4_ + 1) {
    peaks_ind = 0;
    pdVar1 = CorrSurf[(long)corrSurfBuff[0x6c6]._4_4_ + -1];
    pdVar2 = CorrSurf[(long)(0x16 - corrSurfBuff[0x6c6]._4_4_) + -1];
    peak = 0xb - corrSurfBuff[0x6c6]._4_4_;
    for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < corrSurfBuff[0x6c6]._4_4_ + 0x36
        ; corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
      dVar4 = (double)(peaks_ind + 0xc) / (double)(peak + 0xc);
      gain_tmp = dVar4 * (2.0 - dVar4);
      corr_max = gain_tmp * (corrvec1[(long)peaks_ind + -1] + *(double *)(&k + (long)peak * 2));
      pdVar1[(long)corrSurfBuff[0x6c6]._0_4_ + 2] = corr_max;
      if (intrp_a < corr_max) {
        intrp_a = corr_max;
        peaks[9] = (int)((long)pdVar1 +
                         (((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x10) - (long)CorrSurfPtr1) >> 3);
      }
      corr_max = gain_tmp * (corrvec1[(long)peak + -1] + *(double *)(&k + (long)peaks_ind * 2));
      pdVar2[(long)(0xd - corrSurfBuff[0x6c6]._4_4_) + (long)corrSurfBuff[0x6c6]._0_4_] = corr_max;
      if (intrp_a < corr_max) {
        intrp_a = corr_max;
        peaks[9] = (int)((long)pdVar2 +
                         (((long)corrSurfBuff[0x6c6]._0_4_ * 8 +
                          (long)(0xd - corrSurfBuff[0x6c6]._4_4_) * 8) - (long)CorrSurfPtr1) >> 3);
      }
      peak = peak + 1;
      peaks_ind = peaks_ind + 1;
    }
  }
  intrp_a = intrp_a * 0.6;
  max_ind = 0;
  corrSurfBuff[0x6c6]._4_4_ = 1;
  while ((corrSurfBuff[0x6c6]._4_4_ < 0xc && (max_ind != 10))) {
    pdVar1 = CorrSurf[(long)corrSurfBuff[0x6c6]._4_4_ + -1];
    for (corrSurfBuff[0x6c6]._0_4_ = 2; corrSurfBuff[0x6c6]._0_4_ < corrSurfBuff[0x6c6]._4_4_ + 0x34
        ; corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
      corr_max = pdVar1[(long)corrSurfBuff[0x6c6]._0_4_ + 2];
      if ((((intrp_a < corr_max) &&
           (pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x46) + 2] <= corr_max &&
            corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x46) + 2])) &&
          (pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x45) + 2] <= corr_max &&
           corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x45) + 2])) &&
         ((pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x45) + 2] <= corr_max &&
           corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x45) + 2] &&
          (pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x46) + 2] <= corr_max &&
           corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x46) + 2])))) {
        iVar3 = max_ind + 1;
        peaks[(long)max_ind + -2] =
             (int)((long)pdVar1 +
                   (((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x10) - (long)CorrSurfPtr1) >> 3);
        max_ind = iVar3;
        if (iVar3 == 10) break;
      }
    }
    corrSurfBuff[0x6c6]._4_4_ = corrSurfBuff[0x6c6]._4_4_ + 1;
  }
  corrSurfBuff[0x6c6]._4_4_ = 0xc;
  do {
    if ((0x15 < corrSurfBuff[0x6c6]._4_4_) || (max_ind == 10)) {
      if (max_ind < 1) {
        lags2[9] = (double)(peaks[9] % 0x45 + 6);
        local_4328 = (lags2[9] + 11.0) - (double)(peaks[9] / 0x45);
        if (lags2[9] < 20.0) {
          lags2[9] = 20.0;
        }
        if (local_4328 < 20.0) {
          local_4328 = 20.0;
        }
        if (140.0 < lags2[9]) {
          lags2[9] = 140.0;
        }
        if (140.0 < local_4328) {
          local_4328 = 140.0;
        }
        *lags = lags2[9];
        lags[1] = lags2[9];
        lags[2] = local_4328;
        lags[3] = local_4328;
      }
      else {
        for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < max_ind;
            corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
          local_41c8 = peaks[(long)corrSurfBuff[0x6c6]._0_4_ + -2];
          IntrepolFilter(CorrSurfPtr1 + (local_41c8 + -0x46),&intrp_b);
          IntrepolFilter(CorrSurfPtr1 + (local_41c8 + -1),&intrp_c);
          IntrepolFilter(CorrSurfPtr1 + local_41c8,&intrp_d);
          IntrepolFilter(CorrSurfPtr1 + (local_41c8 + 0x45),peak_vals + 9);
          corr_max = CorrSurfPtr1[local_41c8];
          intrp_a = intrp_b;
          if (intrp_b < intrp_c) {
            intrp_a = intrp_c;
          }
          if (intrp_a < intrp_d) {
            intrp_a = intrp_d;
          }
          if (intrp_a < peak_vals[9]) {
            intrp_a = peak_vals[9];
          }
          lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] = (double)(local_41c8 % 0x45 + 6);
          lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
               (lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] + 11.0) - (double)(local_41c8 / 0x45);
          if (corr_max <= intrp_a) {
            if ((intrp_b != intrp_a) || (NAN(intrp_b) || NAN(intrp_a))) {
              if ((intrp_c != intrp_a) || (NAN(intrp_c) || NAN(intrp_a))) {
                if ((intrp_d != intrp_a) || (NAN(intrp_d) || NAN(intrp_a))) {
                  lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] =
                       lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] + 0.5;
                  lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
                       lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] - 0.5;
                  dStack_4378 = intrp_c;
                  T[1][2] = intrp_d;
                  T[1][0] = peak_vals[9];
                  IntrepolFilter(CorrSurfPtr1 + (local_41c8 + 0x8a),T[0] + 1);
                  IntrepolFilter(CorrSurfPtr1 + (local_41c8 + 0x8b),T[2] + 1);
                  T[0][2] = corr_max;
                  T[0][0] = CorrSurfPtr1[local_41c8 + 0x45];
                  T[2][0] = CorrSurfPtr1[local_41c8 + 0x46];
                  T[1][1] = CorrSurfPtr1[local_41c8 + 0x8b];
                }
                else {
                  lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] =
                       lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] + 0.5;
                  lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
                       lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] + 0.5;
                  dStack_4378 = intrp_b;
                  IntrepolFilter(CorrSurfPtr1 + (local_41c8 + -0x45),T[1] + 2);
                  T[1][0] = intrp_d;
                  T[0][1] = peak_vals[9];
                  IntrepolFilter(CorrSurfPtr1 + (local_41c8 + 0x46),T[2] + 1);
                  T[0][2] = CorrSurfPtr1[local_41c8 + -0x45];
                  T[0][0] = corr_max;
                  T[2][0] = CorrSurfPtr1[local_41c8 + 1];
                  T[1][1] = CorrSurfPtr1[local_41c8 + 0x46];
                }
              }
              else {
                lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] =
                     lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] - 0.5;
                lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
                     lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] - 0.5;
                IntrepolFilter(CorrSurfPtr1 + (local_41c8 + -0x47),&stack0xffffffffffffbc88);
                T[1][2] = intrp_b;
                T[1][0] = intrp_c;
                IntrepolFilter(CorrSurfPtr1 + (local_41c8 + 0x44),T[0] + 1);
                T[2][1] = peak_vals[9];
                T[0][2] = CorrSurfPtr1[local_41c8 + -0x46];
                T[0][0] = CorrSurfPtr1[local_41c8 + -1];
                T[2][0] = corr_max;
                T[1][1] = CorrSurfPtr1[local_41c8 + 0x45];
              }
            }
            else {
              lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] =
                   lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] - 0.5;
              lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] =
                   lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1] + 0.5;
              IntrepolFilter(CorrSurfPtr1 + (local_41c8 + -0x8c),&stack0xffffffffffffbc88);
              IntrepolFilter(CorrSurfPtr1 + (local_41c8 + -0x8b),T[1] + 2);
              T[1][0] = intrp_b;
              T[0][1] = intrp_c;
              T[2][1] = intrp_d;
              T[0][2] = CorrSurfPtr1[local_41c8 + -0x8b];
              T[0][0] = CorrSurfPtr1[local_41c8 + -0x46];
              T[2][0] = CorrSurfPtr1[local_41c8 + -0x45];
              T[1][1] = corr_max;
            }
          }
          else {
            dStack_4378 = CorrSurfPtr1[local_41c8 + -0x46];
            T[1][2] = CorrSurfPtr1[local_41c8 + -0x45];
            T[1][0] = corr_max;
            T[0][1] = CorrSurfPtr1[local_41c8 + 0x45];
            T[2][1] = CorrSurfPtr1[local_41c8 + 0x46];
            T[0][2] = intrp_b;
            T[0][0] = intrp_c;
            T[2][0] = intrp_d;
            T[1][1] = peak_vals[9];
          }
          Intrpol2D((double (*) [3])&stack0xffffffffffffbc88,
                    lags2 + (long)corrSurfBuff[0x6c6]._0_4_ + 9,
                    lags2 + (long)corrSurfBuff[0x6c6]._0_4_ + -1,
                    lags1 + (long)corrSurfBuff[0x6c6]._0_4_ + 9);
        }
        intrp_a = 0.0;
        for (corrSurfBuff[0x6c6]._0_4_ = 0; corrSurfBuff[0x6c6]._0_4_ < max_ind;
            corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1) {
          dVar4 = lags1[(long)corrSurfBuff[0x6c6]._0_4_ + 9];
          dVar5 = log(lags2[(long)corrSurfBuff[0x6c6]._0_4_ + 9] +
                      lags2[(long)corrSurfBuff[0x6c6]._0_4_ + -1]);
          dVar5 = pow(0.85,dVar5);
          corr_max = dVar4 * dVar5;
          if (intrp_a < corr_max) {
            intrp_a = corr_max;
            local_41c8 = corrSurfBuff[0x6c6]._0_4_;
          }
        }
        lags2[(long)local_41c8 + 9] = lags2[(long)local_41c8 + 9] * 2.0;
        lags2[(long)local_41c8 + -1] = lags2[(long)local_41c8 + -1] * 2.0;
        if (lags2[(long)local_41c8 + 9] <= 20.0 && lags2[(long)local_41c8 + 9] != 20.0) {
          lags2[(long)local_41c8 + 9] = 20.0;
        }
        if (lags2[(long)local_41c8 + -1] <= 20.0 && lags2[(long)local_41c8 + -1] != 20.0) {
          lags2[(long)local_41c8 + -1] = 20.0;
        }
        if (140.0 < lags2[(long)local_41c8 + 9]) {
          lags2[(long)local_41c8 + 9] = 140.0;
        }
        if (140.0 < lags2[(long)local_41c8 + -1]) {
          lags2[(long)local_41c8 + -1] = 140.0;
        }
        *lags = lags2[(long)local_41c8 + 9];
        lags[1] = lags2[(long)local_41c8 + 9];
        lags[2] = lags2[(long)local_41c8 + -1];
        lags[3] = lags2[(long)local_41c8 + -1];
      }
      return;
    }
    pdVar1 = CorrSurf[(long)corrSurfBuff[0x6c6]._4_4_ + -1];
    for (corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._4_4_ + -9;
        corrSurfBuff[0x6c6]._0_4_ < 0x3f; corrSurfBuff[0x6c6]._0_4_ = corrSurfBuff[0x6c6]._0_4_ + 1)
    {
      corr_max = pdVar1[(long)corrSurfBuff[0x6c6]._0_4_ + 2];
      if ((((intrp_a < corr_max) &&
           (pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x46) + 2] <= corr_max &&
            corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x46) + 2])) &&
          (pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x45) + 2] <= corr_max &&
           corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + -0x45) + 2])) &&
         ((pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x45) + 2] <= corr_max &&
           corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x45) + 2] &&
          (pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x46) + 2] <= corr_max &&
           corr_max != pdVar1[(long)(corrSurfBuff[0x6c6]._0_4_ + 0x46) + 2])))) {
        iVar3 = max_ind + 1;
        peaks[(long)max_ind + -2] =
             (int)((long)pdVar1 +
                   (((long)corrSurfBuff[0x6c6]._0_4_ * 8 + 0x10) - (long)CorrSurfPtr1) >> 3);
        max_ind = iVar3;
        if (iVar3 == 10) break;
      }
    }
    corrSurfBuff[0x6c6]._4_4_ = corrSurfBuff[0x6c6]._4_4_ + 1;
  } while( true );
}

Assistant:

void WebRtcIsac_InitializePitch(const double *in,
                                const double old_lag,
                                const double old_gain,
                                PitchAnalysisStruct *State,
                                double *lags)
{
  double buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2];
  double ratio, log_lag, gain_bias;
  double bias;
  double corrvec1[PITCH_LAG_SPAN2];
  double corrvec2[PITCH_LAG_SPAN2];
  int m, k;
  // Allocating 10 extra entries at the begining of the CorrSurf
  double corrSurfBuff[10 + (2*PITCH_BW+3)*(PITCH_LAG_SPAN2+4)];
  double* CorrSurf[2*PITCH_BW+3];
  double *CorrSurfPtr1, *CorrSurfPtr2;
  double LagWin[3] = {0.2, 0.5, 0.98};
  int ind1, ind2, peaks_ind, peak, max_ind;
  int peaks[PITCH_MAX_NUM_PEAKS];
  double adj, gain_tmp;
  double corr, corr_max;
  double intrp_a, intrp_b, intrp_c, intrp_d;
  double peak_vals[PITCH_MAX_NUM_PEAKS];
  double lags1[PITCH_MAX_NUM_PEAKS];
  double lags2[PITCH_MAX_NUM_PEAKS];
  double T[3][3];
  int row;

  for(k = 0; k < 2*PITCH_BW+3; k++)
  {
    CorrSurf[k] = &corrSurfBuff[10 + k * (PITCH_LAG_SPAN2+4)];
  }
  /* reset CorrSurf matrix */
  memset(corrSurfBuff, 0, sizeof(double) * (10 + (2*PITCH_BW+3) * (PITCH_LAG_SPAN2+4)));

  //warnings -DH
  max_ind = 0;
  peak = 0;

  /* copy old values from state buffer */
  memcpy(buf_dec, State->dec_buffer, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* decimation; put result after the old values */
  WebRtcIsac_DecimateAllpass(in, State->decimator_state, PITCH_FRAME_LEN,
                             &buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2]);

  /* low-pass filtering */
  for (k = PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2; k < PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2; k++)
    buf_dec[k] += 0.75 * buf_dec[k-1] - 0.25 * buf_dec[k-2];

  /* copy end part back into state buffer */
  memcpy(State->dec_buffer, buf_dec+PITCH_FRAME_LEN/2, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* compute correlation for first and second half of the frame */
  PCorr(buf_dec, corrvec1);
  PCorr(buf_dec + PITCH_CORR_STEP2, corrvec2);

  /* bias towards pitch lag of previous frame */
  log_lag = log(0.5 * old_lag);
  gain_bias = 4.0 * old_gain * old_gain;
  if (gain_bias > 0.8) gain_bias = 0.8;
  for (k = 0; k < PITCH_LAG_SPAN2; k++)
  {
    ratio = log((double) (k + (PITCH_MIN_LAG/2-2))) - log_lag;
    bias = 1.0 + gain_bias * exp(-5.0 * ratio * ratio);
    corrvec1[k] *= bias;
  }

  /* taper correlation functions */
  for (k = 0; k < 3; k++) {
    gain_tmp = LagWin[k];
    corrvec1[k] *= gain_tmp;
    corrvec2[k] *= gain_tmp;
    corrvec1[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
    corrvec2[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
  }

  corr_max = 0.0;
  /* fill middle row of correlation surface */
  ind1 = 0;
  ind2 = 0;
  CorrSurfPtr1 = &CorrSurf[PITCH_BW][2];
  for (k = 0; k < PITCH_LAG_SPAN2; k++) {
    corr = corrvec1[ind1++] + corrvec2[ind2++];
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
  }
  /* fill first and last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW;
  CorrSurfPtr1 = &CorrSurf[0][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW][PITCH_BW+2];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.2 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill second and next to last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW-1;
  CorrSurfPtr1 = &CorrSurf[1][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-1][PITCH_BW+1];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+1; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.9 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill remainder of correlation surface */
  for (m = 2; m < PITCH_BW; m++) {
    ind1 = 0;
    ind2 = PITCH_BW - m;         /* always larger than ind1 */
    CorrSurfPtr1 = &CorrSurf[m][2];
    CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-m][PITCH_BW+2-m];
    for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+m; k++) {
      ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
      adj = ratio * (2.0 - ratio);    /* adjustment factor; inverse parabola as a function of ratio */
      corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
      CorrSurfPtr1[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
      }
      corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
      CorrSurfPtr2[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
      }
    }
  }

  /* threshold value to qualify as a peak */
  corr_max *= 0.6;

  peaks_ind = 0;
  /* find peaks */
  for (m = 1; m < PITCH_BW+1; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2; k < PITCH_LAG_SPAN2-PITCH_BW-2+m; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }
  for (m = PITCH_BW+1; m < 2*PITCH_BW; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2+m-PITCH_BW; k < PITCH_LAG_SPAN2-2; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }

  if (peaks_ind > 0) {
    /* examine each peak */
    CorrSurfPtr1 = &CorrSurf[0][0];
    for (k = 0; k < peaks_ind; k++) {
      peak = peaks[k];

      /* compute four interpolated values around current peak */
      IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)], &intrp_a);
      IntrepolFilter(&CorrSurfPtr1[peak - 1            ], &intrp_b);
      IntrepolFilter(&CorrSurfPtr1[peak                ], &intrp_c);
      IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)], &intrp_d);

      /* determine maximum of the interpolated values */
      corr = CorrSurfPtr1[peak];
      corr_max = intrp_a;
      if (intrp_b > corr_max) corr_max = intrp_b;
      if (intrp_c > corr_max) corr_max = intrp_c;
      if (intrp_d > corr_max) corr_max = intrp_d;

      /* determine where the peak sits and fill a 3x3 matrix around it */
      row = peak / (PITCH_LAG_SPAN2+4);
      lags1[k] = (double) ((peak - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
      lags2[k] = (double) (lags1[k] + PITCH_BW - row);
      if ( corr > corr_max ) {
        T[0][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
        T[2][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
        T[1][1] = corr;
        T[0][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        T[2][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        T[1][0] = intrp_a;
        T[0][1] = intrp_b;
        T[2][1] = intrp_c;
        T[1][2] = intrp_d;
      } else {
        if (intrp_a == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] += 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - 2*(PITCH_LAG_SPAN2+5)], &T[0][0]);
          IntrepolFilter(&CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)], &T[2][0]);
          T[1][1] = intrp_a;
          T[0][2] = intrp_b;
          T[2][2] = intrp_c;
          T[1][0] = CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)];
          T[0][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[2][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[1][2] = corr;
        } else if (intrp_b == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] -= 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+6)], &T[0][0]);
          T[2][0] = intrp_a;
          T[1][1] = intrp_b;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+3)], &T[0][2]);
          T[2][2] = intrp_d;
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[0][1] = CorrSurfPtr1[peak - 1];
          T[2][1] = corr;
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        } else if (intrp_c == corr_max) {
          lags1[k] += 0.5;
          lags2[k] += 0.5;
          T[0][0] = intrp_a;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)], &T[2][0]);
          T[1][1] = intrp_c;
          T[0][2] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)], &T[2][2]);
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[0][1] = corr;
          T[2][1] = CorrSurfPtr1[peak + 1];
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        } else {
          lags1[k] += 0.5;
          lags2[k] -= 0.5;
          T[0][0] = intrp_b;
          T[2][0] = intrp_c;
          T[1][1] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + 2*(PITCH_LAG_SPAN2+4)], &T[0][2]);
          IntrepolFilter(&CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)], &T[2][2]);
          T[1][0] = corr;
          T[0][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
          T[2][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
          T[1][2] = CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)];
        }
      }

      /* 2D parabolic interpolation gives more accurate lags and peak value */
      Intrpol2D(T, &lags1[k], &lags2[k], &peak_vals[k]);
    }

    /* determine the highest peak, after applying a bias towards short lags */
    corr_max = 0.0;
    for (k = 0; k < peaks_ind; k++) {
      corr = peak_vals[k] * pow(PITCH_PEAK_DECAY, log(lags1[k] + lags2[k]));
      if (corr > corr_max) {
        corr_max = corr;
        peak = k;
      }
    }

    lags1[peak] *= 2.0;
    lags2[peak] *= 2.0;

    if (lags1[peak] < (double) PITCH_MIN_LAG) lags1[peak] = (double) PITCH_MIN_LAG;
    if (lags2[peak] < (double) PITCH_MIN_LAG) lags2[peak] = (double) PITCH_MIN_LAG;
    if (lags1[peak] > (double) PITCH_MAX_LAG) lags1[peak] = (double) PITCH_MAX_LAG;
    if (lags2[peak] > (double) PITCH_MAX_LAG) lags2[peak] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[peak];
    lags[1] = lags1[peak];
    lags[2] = lags2[peak];
    lags[3] = lags2[peak];
  }
  else
  {
    row = max_ind / (PITCH_LAG_SPAN2+4);
    lags1[0] = (double) ((max_ind - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
    lags2[0] = (double) (lags1[0] + PITCH_BW - row);

    if (lags1[0] < (double) PITCH_MIN_LAG) lags1[0] = (double) PITCH_MIN_LAG;
    if (lags2[0] < (double) PITCH_MIN_LAG) lags2[0] = (double) PITCH_MIN_LAG;
    if (lags1[0] > (double) PITCH_MAX_LAG) lags1[0] = (double) PITCH_MAX_LAG;
    if (lags2[0] > (double) PITCH_MAX_LAG) lags2[0] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[0];
    lags[1] = lags1[0];
    lags[2] = lags2[0];
    lags[3] = lags2[0];
  }
}